

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps2.cpp
# Opt level: O0

int32 rw::ps2::getSizeADC(void *object,int32 offset,int32 param_3)

{
  ADCData *adc;
  Geometry *geometry;
  int32 param_2_local;
  int32 offset_local;
  void *object_local;
  
  if (*(int *)((long)object + (long)offset) == 0) {
    object_local._4_4_ = 0;
  }
  else if ((*(uint *)((long)object + 0x10) & 0x1000000) == 0) {
    object_local._4_4_ = (((int *)((long)object + (long)offset))[4] + 3U & 0xfffffffc) + 0x10;
  }
  else {
    object_local._4_4_ = 0x10;
  }
  return object_local._4_4_;
}

Assistant:

static int32
getSizeADC(void *object, int32 offset, int32)
{
	Geometry *geometry = (Geometry*)object;
	ADCData *adc = PLUGINOFFSET(ADCData, object, offset);
	if(!adc->adcFormatted)
		return 0;
	if(geometry->flags & Geometry::NATIVE)
		return 16;
	return 16 + (adc->numBits+3 & ~3);
}